

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void list_append_to(list_t *list,void *data,list_node_t *old)

{
  list_node_t *plVar1;
  list_node_t *plVar2;
  
  plVar2 = (list_node_t *)malloc(0x18);
  plVar2->next = (list_node_t *)0x0;
  plVar2->prev = (list_node_t *)0x0;
  plVar2->data = data;
  plVar1 = old->next;
  if (plVar1 != (list_node_t *)0x0) {
    list = (list_t *)plVar1;
  }
  ((list_node_t *)list)->prev = plVar2;
  plVar2->next = plVar1;
  plVar2->prev = old;
  old->next = plVar2;
  return;
}

Assistant:

void
list_append_to(
    list_t* list,
    void* data,
    list_node_t* old)
{
    list_node_t* new = list_node_new();
    new->data = data;

    if (old->next)
        old->next->prev = new;
    else
        list->tail = new;
    new->next = old->next;
    new->prev = old;
    old->next = new;
}